

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O1

bool_t bf_put_uint8(bfile_t *bfile,uint8_t value)

{
  if ((ulong)bfile->buffer_size <= bfile->pos - bfile->ipos) {
    bf_write_buffer(bfile);
  }
  bfile->buffer[(int)(bfile->pos % (ulong)bfile->buffer_size)] = value;
  bfile->pos = bfile->pos + 1;
  return 1;
}

Assistant:

bool_t
bf_put_uint8(
    bfile_t * bfile,
    uint8_t value )
{
    uint8_t * buffer;
    int bufpos;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_WRITABLE) != FALSE );

    if ( (bfile->pos - bfile->ipos) >= bfile->buffer_size ) 
        bf_write_buffer( bfile );

    buffer = bfile->buffer;
    bufpos = bfile->pos % bfile->buffer_size;
    buffer[bufpos] = value & 0xff;
    bfile->pos++;
    return TRUE;
}